

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_SubDRef __thiscall ON_SubDMesh::SubDRef(ON_SubDMesh *this)

{
  ON_SubDMeshImpl *subd_limple;
  ON_SubD *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 *in_RSI;
  ON_SubDRef OVar2;
  
  subd_limple = (ON_SubDMeshImpl *)*in_RSI;
  if (subd_limple == (ON_SubDMeshImpl *)0x0) {
    ON_SubDRef::ON_SubDRef((ON_SubDRef *)this,&ON_SubDRef::Empty);
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    ON_SubDRef::ON_SubDRef((ON_SubDRef *)this);
    this_00 = ON_SubDRef::NewSubD((ON_SubDRef *)this);
    ON_SubD::ShareDimple(this_00,subd_limple);
    _Var1._M_pi = extraout_RDX;
  }
  OVar2.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  OVar2.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_SubDRef)OVar2.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_SubDRef ON_SubDMesh::SubDRef() const
{
  const ON_SubDMeshImpl* impl = m_impl_sp.get();
  if ( nullptr == impl )
    return ON_SubDRef::Empty;
  ON_SubDRef subd_ref;
  ON_SubD& subd = subd_ref.NewSubD();
  subd.ShareDimple(*impl);
  return subd_ref;
}